

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O1

void __thiscall yactfr::internal::StrScanner::save(StrScanner *this)

{
  pointer *pp_Var1;
  iterator __position;
  _tStackFrame local_18;
  
  local_18.at = this->_at;
  local_18.lineBegin = this->_lineBegin;
  local_18.nbLines = this->_nbLines;
  __position._M_current =
       (this->_stack).
       super__Vector_base<yactfr::internal::StrScanner::_tStackFrame,_std::allocator<yactfr::internal::StrScanner::_tStackFrame>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_stack).
      super__Vector_base<yactfr::internal::StrScanner::_tStackFrame,_std::allocator<yactfr::internal::StrScanner::_tStackFrame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<yactfr::internal::StrScanner::_tStackFrame,_std::allocator<yactfr::internal::StrScanner::_tStackFrame>_>
    ::_M_realloc_insert<yactfr::internal::StrScanner::_tStackFrame>
              (&this->_stack,__position,&local_18);
  }
  else {
    (__position._M_current)->nbLines = local_18.nbLines;
    (__position._M_current)->at = local_18.at;
    (__position._M_current)->lineBegin = local_18.lineBegin;
    pp_Var1 = &(this->_stack).
               super__Vector_base<yactfr::internal::StrScanner::_tStackFrame,_std::allocator<yactfr::internal::StrScanner::_tStackFrame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pp_Var1 = *pp_Var1 + 1;
  }
  return;
}

Assistant:

void save()
    {
        _stack.push_back({_at, _lineBegin, _nbLines});
    }